

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_generator.cc
# Opt level: O0

string * grpc_cpp_generator::anon_unknown_3::FilenameIdentifier
                   (string *__return_storage_ptr__,string *filename)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  char cVar4;
  undefined4 local_20;
  char c;
  uint i;
  string *filename_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_20 = 0; uVar2 = std::__cxx11::string::size(), local_20 < uVar2; local_20 = local_20 + 1
      ) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)filename);
    iVar1 = isalnum((int)*pcVar3);
    cVar4 = (char)__return_storage_ptr__;
    if (iVar1 == 0) {
      std::__cxx11::string::push_back(cVar4);
      std::__cxx11::string::push_back(cVar4);
      std::__cxx11::string::push_back(cVar4);
    }
    else {
      std::__cxx11::string::push_back(cVar4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static grpc::string FilenameIdentifier(const grpc::string &filename) {
  grpc::string result;
  for (unsigned i = 0; i < filename.size(); i++) {
    char c = filename[i];
    if (isalnum(c)) {
      result.push_back(c);
    } else {
      static char hex[] = "0123456789abcdef";
      result.push_back('_');
      result.push_back(hex[(c >> 4) & 0xf]);
      result.push_back(hex[c & 0xf]);
    }
  }
  return result;
}